

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O0

void flatbuffers::tests::RunTest
               (IDLOptions *opts,string *proto_path,string *proto_file,string *golden_file,
               string *import_proto_file)

{
  bool bVar1;
  Status SVar2;
  char *pcVar3;
  pointer pCVar4;
  ulong uVar5;
  char *pcVar6;
  string local_1ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ac0;
  undefined1 local_1aa0 [8];
  string imported_fbs;
  string local_1a78 [32];
  string local_1a58 [8];
  string import_fbs;
  Parser import_parser;
  undefined1 local_fa8 [8];
  Parser parser2;
  string local_820 [32];
  string local_800 [8];
  string fbs;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
  fbs_generator;
  undefined1 local_7c8 [8];
  Parser parser;
  char *include_directories [2];
  string *import_proto_file_local;
  string *golden_file_local;
  string *proto_file_local;
  string *proto_path_local;
  IDLOptions *opts_local;
  
  parser._1912_8_ = std::__cxx11::string::c_str();
  Parser::Parser((Parser *)local_7c8,opts);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = Parser::Parse((Parser *)local_7c8,pcVar3,(char **)&parser.anonymous_counter_,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser.Parse(proto_file.c_str(), include_directories)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x11,"");
  NewFBSCodeGenerator((flatbuffers *)(fbs.field_2._M_local_buf + 8),true);
  std::__cxx11::string::string(local_800);
  pCVar4 = std::
           unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
           ::operator->((unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
                         *)((long)&fbs.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_820,"test",(allocator<char> *)((long)&parser2.parse_depth_counter_ + 3));
  SVar2 = (*pCVar4->_vptr_CodeGenerator[3])(pCVar4,local_7c8,local_820,local_800);
  TestEq<flatbuffers::CodeGenerator::Status,flatbuffers::CodeGenerator::Status>
            (SVar2,OK,
             "\'fbs_generator->GenerateCodeString(parser, \"test\", fbs)\' != \'CodeGenerator::Status::OK\'"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
             ,0x17,"");
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator((allocator<char> *)((long)&parser2.parse_depth_counter_ + 3));
  IDLOptions::IDLOptions((IDLOptions *)&import_parser.anonymous_counter_);
  Parser::Parser((Parser *)local_fa8,(IDLOptions *)&import_parser.anonymous_counter_);
  IDLOptions::~IDLOptions((IDLOptions *)&import_parser.anonymous_counter_);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    Parser::Parser((Parser *)((long)&import_fbs.field_2 + 8),opts);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = Parser::Parse((Parser *)((long)&import_fbs.field_2 + 8),pcVar3,
                          (char **)&parser.anonymous_counter_,(char *)0x0);
    TestEq<bool,bool>(bVar1,true,
                      "\'import_parser.Parse(import_proto_file.c_str(), include_directories)\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                      ,0x20,"");
    std::__cxx11::string::string(local_1a58);
    pCVar4 = std::
             unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
             ::operator->((unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
                           *)((long)&fbs.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_1a78,"test",(allocator<char> *)(imported_fbs.field_2._M_local_buf + 0xf));
    SVar2 = (*pCVar4->_vptr_CodeGenerator[3])
                      (pCVar4,(undefined1 *)((long)&import_fbs.field_2 + 8),local_1a78,local_1a58);
    TestEq<flatbuffers::CodeGenerator::Status,flatbuffers::CodeGenerator::Status>
              (SVar2,OK,
               "\'fbs_generator->GenerateCodeString(import_parser, \"test\", import_fbs)\' != \'CodeGenerator::Status::OK\'"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
               ,0x24,"");
    std::__cxx11::string::~string(local_1a78);
    std::allocator<char>::~allocator((allocator<char> *)(imported_fbs.field_2._M_local_buf + 0xf));
    AbsolutePath(&local_1ae0,proto_path);
    std::operator+(&local_1ac0,&local_1ae0,"/imported.fbs");
    PosixPath((string *)local_1aa0,&local_1ac0);
    std::__cxx11::string::~string((string *)&local_1ac0);
    std::__cxx11::string::~string((string *)&local_1ae0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar1 = Parser::Parse((Parser *)local_fa8,pcVar3,(char **)&parser.anonymous_counter_,pcVar6);
    TestEq<bool,bool>(bVar1,true,
                      "\'parser2.Parse(import_fbs.c_str(), include_directories, imported_fbs.c_str())\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                      ,0x2c,"");
    std::__cxx11::string::~string((string *)local_1aa0);
    std::__cxx11::string::~string(local_1a58);
    Parser::~Parser((Parser *)((long)&import_fbs.field_2 + 8));
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = Parser::Parse((Parser *)local_fa8,pcVar3,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parser2.Parse(fbs.c_str(), nullptr)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x2f,"");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar3,pcVar6,"\'fbs.c_str()\' != \'golden_file.c_str()\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
            ,0x30,"");
  Parser::~Parser((Parser *)local_fa8);
  std::__cxx11::string::~string(local_800);
  std::unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>::
  ~unique_ptr((unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
               *)((long)&fbs.field_2 + 8));
  Parser::~Parser((Parser *)local_7c8);
  return;
}

Assistant:

void RunTest(const flatbuffers::IDLOptions &opts, const std::string &proto_path,
             const std::string &proto_file, const std::string &golden_file,
             const std::string import_proto_file) {
  const char *include_directories[] = { proto_path.c_str(), nullptr };

  // Parse proto.
  flatbuffers::Parser parser(opts);
  TEST_EQ(parser.Parse(proto_file.c_str(), include_directories), true);

  // Generate fbs.
  std::unique_ptr<CodeGenerator> fbs_generator = NewFBSCodeGenerator(true);
  std::string fbs;
  TEST_EQ(fbs_generator->GenerateCodeString(parser, "test", fbs),
          CodeGenerator::Status::OK);

  // Ensure generated file is parsable.
  flatbuffers::Parser parser2;

  if (!import_proto_file.empty()) {
    // Generate fbs from import.proto
    flatbuffers::Parser import_parser(opts);
    TEST_EQ(import_parser.Parse(import_proto_file.c_str(), include_directories),
            true);
    std::string import_fbs;
    TEST_EQ(
        fbs_generator->GenerateCodeString(import_parser, "test", import_fbs),
        CodeGenerator::Status::OK);
    // auto import_fbs = flatbuffers::GenerateFBS(import_parser, "test", true);
    // Since `imported.fbs` isn't in the filesystem AbsolutePath can't figure it
    // out by itself. We manually construct it so Parser works.
    std::string imported_fbs = flatbuffers::PosixPath(
        flatbuffers::AbsolutePath(proto_path) + "/imported.fbs");
    TEST_EQ(parser2.Parse(import_fbs.c_str(), include_directories,
                          imported_fbs.c_str()),
            true);
  }

  TEST_EQ(parser2.Parse(fbs.c_str(), nullptr), true);
  TEST_EQ_STR(fbs.c_str(), golden_file.c_str());
}